

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<2UL>::SetWritable
          (SimpleTypeHandler<2UL> *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  JavascriptLibrary *typeHandler_00;
  uint propertyKey;
  bool bVar1;
  BOOL BVar2;
  DynamicTypeHandler *pDVar3;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  ScriptContext *scriptContext_00;
  undefined1 local_60 [16];
  JavascriptLibrary *library;
  DynamicTypeHandler *typeHandler;
  Type *oldType;
  Type TStack_38;
  uint32 indexVal;
  ScriptContext *scriptContext;
  uint local_28;
  uint uStack_24;
  PropertyIndex index;
  BOOL value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<2UL> *this_local;
  
  local_28 = value;
  uStack_24 = propertyId;
  _value_local = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  BVar2 = GetDescriptor(this,propertyId,(PropertyIndex *)((long)&scriptContext + 6));
  if (BVar2 == 0) {
    TStack_38.ptr = (RuntimeFunction *)RecyclableObject::GetScriptContext(_value_local);
    bVar1 = DynamicObject::HasObjectArray((DynamicObject *)_value_local);
    if ((bVar1) &&
       (BVar2 = ScriptContext::IsNumericPropertyId
                          ((ScriptContext *)TStack_38.ptr,uStack_24,(uint32 *)((long)&oldType + 4)),
       BVar2 != 0)) {
      pDVar3 = ConvertToTypeWithItemAttributes(this,(DynamicObject *)_value_local);
      this_local._4_4_ =
           (*pDVar3->_vptr_DynamicTypeHandler[0x2a])
                     (pDVar3,_value_local,(ulong)uStack_24,(ulong)local_28);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    typeHandler = (DynamicTypeHandler *)RecyclableObject::GetType((RecyclableObject *)_value_local);
    if (local_28 == 0) {
      BVar2 = ClearAttribute(this,(DynamicObject *)_value_local,scriptContext._6_2_,'\x04');
      if (BVar2 != 0) {
        DynamicObject::ChangeTypeIf((DynamicObject *)_value_local,(Type *)typeHandler);
        library = (JavascriptLibrary *)
                  DynamicTypeHandler::GetCurrentTypeHandler((DynamicObject *)_value_local);
        local_60._8_8_ = RecyclableObject::GetLibrary((RecyclableObject *)_value_local);
        JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                  ((JavascriptLibrary *)local_60);
        this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                  operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                              *)local_60);
        propertyKey = uStack_24;
        typeHandler_00 = library;
        scriptContext_00 = JavascriptLibrary::GetScriptContext((JavascriptLibrary *)local_60._8_8_);
        PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
                  (this_00,(DynamicTypeHandler *)typeHandler_00,'\0',propertyKey,scriptContext_00);
      }
    }
    else {
      BVar2 = SetAttribute(this,(DynamicObject *)_value_local,scriptContext._6_2_,'\x04');
      if (BVar2 != 0) {
        DynamicObject::ChangeTypeIf((DynamicObject *)_value_local,(Type *)typeHandler);
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            ScriptContext* scriptContext = instance->GetScriptContext();
            uint32 indexVal;
            if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, index, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, index, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler* const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }